

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O3

QLayoutItem * __thiscall
QFormLayoutPrivate::replaceAt(QFormLayoutPrivate *this,int index,QLayoutItem *newitem)

{
  long *plVar1;
  QFormLayoutItem *pQVar2;
  long lVar3;
  long *plVar4;
  int iVar5;
  pointer ppQVar6;
  long lVar7;
  QLayoutItem *pQVar8;
  long in_FS_OFFSET;
  char local_40 [24];
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (newitem == (QLayoutItem *)0x0) {
    pQVar8 = (QLayoutItem *)0x0;
  }
  else {
    if ((((ulong)(long)index < (ulong)(this->m_things).d.size) &&
        (pQVar2 = (this->m_things).d.ptr[index], pQVar2 != (QFormLayoutItem *)0x0)) &&
       (lVar3 = (this->m_matrix).m_storage.d.size, lVar3 != 0)) {
      plVar4 = *(long **)&(this->super_QLayoutPrivate).field_0x8;
      iVar5 = 1;
      lVar7 = 0;
      do {
        if (lVar3 << 3 == lVar7) goto LAB_0039aec2;
        iVar5 = iVar5 + -1;
        plVar1 = (long *)((long)(this->m_matrix).m_storage.d.ptr + lVar7);
        lVar7 = lVar7 + 8;
      } while ((QFormLayoutItem *)*plVar1 != pQVar2);
      if (iVar5 != 1) {
        iVar5 = -iVar5;
        ppQVar6 = QList<QFormLayoutItem_*>::data(&(this->m_matrix).m_storage);
        pQVar8 = ppQVar6[(int)(iVar5 % 2 + (iVar5 - (iVar5 >> 0x1f) & 0xfffffffeU))]->item;
        ppQVar6[(int)(iVar5 % 2 + (iVar5 - (iVar5 >> 0x1f) & 0xfffffffeU))]->item = newitem;
        (**(code **)(*plVar4 + 0x70))(plVar4);
        goto LAB_0039aef7;
      }
    }
LAB_0039aec2:
    local_40[0] = '\x02';
    local_40[1] = '\0';
    local_40[2] = '\0';
    local_40[3] = '\0';
    local_40[4] = '\0';
    local_40[5] = '\0';
    local_40[6] = '\0';
    local_40[7] = '\0';
    local_40[8] = '\0';
    local_40[9] = '\0';
    local_40[10] = '\0';
    local_40[0xb] = '\0';
    local_40[0xc] = '\0';
    local_40[0xd] = '\0';
    local_40[0xe] = '\0';
    local_40[0xf] = '\0';
    local_40[0x10] = '\0';
    local_40[0x11] = '\0';
    local_40[0x12] = '\0';
    local_40[0x13] = '\0';
    local_40[0x14] = '\0';
    local_40[0x15] = '\0';
    local_40[0x16] = '\0';
    local_40[0x17] = '\0';
    local_28 = "default";
    pQVar8 = (QLayoutItem *)0x0;
    QMessageLogger::warning(local_40,"QFormLayoutPrivate::replaceAt: Invalid index %d",index);
  }
LAB_0039aef7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar8;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem* QFormLayoutPrivate::replaceAt(int index, QLayoutItem *newitem)
{
    Q_Q(QFormLayout);
    if (!newitem)
        return nullptr;
    const int storageIndex = storageIndexFromLayoutItem(m_matrix, m_things.value(index));
    if (Q_UNLIKELY(storageIndex == -1)) {
        // ### Qt6 - fix warning too when this class becomes public
        qWarning("QFormLayoutPrivate::replaceAt: Invalid index %d", index);
        return nullptr;
    }

    int row, col;
    QFormLayoutPrivate::ItemMatrix::storageIndexToPosition(storageIndex, &row, &col);
    Q_ASSERT(m_matrix(row, col));

    QFormLayoutItem *item = m_matrix(row, col);
    Q_ASSERT(item);

    QLayoutItem *olditem = item->item;
    item->item = newitem;

    q->invalidate();
    return olditem;
}